

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O1

char * nhr_response_find_http_field_value(char *received,char *field)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  ushort **ppuVar4;
  
  pcVar2 = strstr(received,field);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    sVar3 = strlen(field);
    ppuVar4 = __ctype_b_loc();
    pcVar2 = pcVar2 + (sVar3 - 1);
    do {
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (((*ppuVar4)[*pcVar1] & 8) == 0);
  }
  return pcVar2;
}

Assistant:

char * nhr_response_find_http_field_value(char * received, const char * field) {
	char * sub = strstr(received, field);
	if (!sub) {
		return NULL;
	}

	sub += strlen(field);
	while (!isalnum(*sub)) {
		sub++;
	}

	return sub;
}